

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O1

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  fixed_y_t *dst;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint width;
  uint height;
  uint32_t uVar7;
  uint32_t uVar8;
  bool bVar9;
  uint uVar10;
  undefined2 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  fixed_y_t *dst_00;
  uint16_t *puVar16;
  uint16_t *puVar17;
  uint16_t *ptr;
  int16_t *ptr_00;
  fixed_t *ptr_01;
  fixed_t *dst_01;
  long lVar18;
  ulong uVar19;
  uint64_t uVar20;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  uint8_t *puVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  uint16_t *puVar29;
  uint8_t *puVar30;
  ulong uVar31;
  long lVar32;
  int v;
  int iVar33;
  ulong uVar34;
  uint8_t uVar35;
  int iVar36;
  long lVar37;
  uint8_t uVar38;
  int iVar39;
  uint uVar40;
  uint16_t *puVar41;
  long lVar42;
  uint8_t *puVar43;
  int16_t *piVar44;
  int16_t *piVar45;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  VP8Random *rg;
  int *piVar51;
  uint32_t *puVar52;
  uint64_t uVar53;
  uint64_t uVar54;
  int16_t *piVar55;
  int off;
  long lVar56;
  ulong uVar57;
  long lVar58;
  bool bVar59;
  bool bVar60;
  double dVar61;
  undefined1 auVar62 [16];
  fixed_y_t *src1;
  int len;
  int uv_w;
  fixed_y_t *src2;
  VP8Random base_rg;
  uint8_t *local_2d0;
  uint16_t *local_2b8;
  uint16_t *local_2b0;
  uint8_t *local_2a8;
  int16_t *local_298;
  uint8_t *local_260;
  uint8_t *local_248;
  uint16_t *local_228;
  fixed_t *local_220;
  int16_t *local_218;
  int16_t *local_208;
  int16_t *local_200;
  int local_1d0;
  ulong local_180;
  VP8Random local_118;
  
  width = picture->width;
  uVar31 = (ulong)width;
  height = picture->height;
  bVar59 = true;
  if (a_ptr != (uint8_t *)0x0) {
    WebPInitAlphaProcessing();
    if (step == 1) {
      if (0 < (int)height) {
        puVar30 = a_ptr;
        uVar40 = height;
        do {
          iVar12 = (*WebPHasAlpha8b)(puVar30,width);
          bVar59 = iVar12 == 0;
          if (!bVar59) break;
          puVar30 = puVar30 + rgb_stride;
          bVar9 = 1 < (int)uVar40;
          uVar40 = uVar40 - 1;
        } while (bVar9);
      }
    }
    else if (0 < (int)height) {
      puVar30 = a_ptr;
      uVar40 = height;
      do {
        iVar12 = (*WebPHasAlpha32b)(puVar30,width);
        bVar59 = iVar12 == 0;
        if (!bVar59) break;
        puVar30 = puVar30 + rgb_stride;
        bVar9 = 1 < (int)uVar40;
        uVar40 = uVar40 - 1;
      } while (bVar9);
    }
  }
  picture->colorspace = (uint)(bVar59 ^ 1) << 2;
  picture->use_argb = 0;
  iVar12 = WebPPictureAllocYUVA(picture,width,height);
  if (iVar12 == 0) {
    return 0;
  }
  if (((use_iterative_conversion == 0) || ((int)width < 4)) || ((int)height < 4)) {
    uVar40 = (int)(width + 1) >> 1;
    puVar16 = (uint16_t *)WebPSafeMalloc((long)(int)(uVar40 * 4),2);
    local_2b0 = (uint16_t *)picture->y;
    puVar30 = picture->u;
    local_2a8 = picture->v;
    local_248 = picture->a;
    rg = (VP8Random *)0x0;
    bVar9 = dithering <= 0.0;
    if (bVar9) {
      puVar52 = (uint32_t *)0x8;
    }
    else {
      puVar52 = local_118.tab_;
      rg = &local_118;
      VP8InitRandom(rg,dithering);
    }
    WebPInitConvertARGBToYUV();
    iVar12 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    if (iVar12 == 0) {
      if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
         (kGammaTablesOk == 0)) {
        puVar17 = kGammaToLinearTab;
        lVar56 = 0;
        do {
          dVar61 = pow((double)(int)lVar56 * 0.00392156862745098,0.8);
          *puVar17 = (uint16_t)(int)(dVar61 * 4095.0 + 0.5);
          lVar56 = lVar56 + 1;
          puVar17 = puVar17 + 1;
        } while (lVar56 != 0x100);
        piVar51 = kLinearToGammaTab;
        lVar56 = 0;
        do {
          dVar61 = pow((double)(int)lVar56 * 0.03125763125763126,1.25);
          *piVar51 = (int)(dVar61 * 255.0 + 0.5);
          lVar56 = lVar56 + 1;
          piVar51 = piVar51 + 1;
        } while (lVar56 != 0x21);
        kGammaTablesOk = 1;
      }
      InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
      pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
    }
    if (puVar16 != (uint16_t *)0x0) {
      puVar25 = r_ptr;
      local_2d0 = b_ptr;
      local_260 = a_ptr;
      if (0 < (int)height >> 1) {
        lVar26 = (long)rgb_stride;
        lVar18 = (long)(rgb_stride * 2);
        lVar56 = 0;
        if (bVar59 == false) {
          lVar56 = lVar18;
        }
        iVar12 = 0;
        do {
          if (!bVar9 || step != 3) {
            if (0 < (int)width) {
              uVar34 = 0;
              lVar27 = 0;
              do {
                bVar1 = puVar25[lVar27];
                bVar2 = g_ptr[lVar27];
                bVar3 = local_2d0[lVar27];
                if (rg == (VP8Random *)0x0) {
                  iVar36 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                else {
                  uVar7 = puVar52[rg->index1_];
                  uVar8 = puVar52[rg->index2_];
                  iVar36 = rg->amp_;
                  puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                  iVar13 = rg->index1_ + 1;
                  if (iVar13 == 0x37) {
                    iVar13 = 0;
                  }
                  rg->index1_ = iVar13;
                  iVar13 = rg->index2_ + 1;
                  if (iVar13 == 0x37) {
                    iVar13 = 0;
                  }
                  rg->index2_ = iVar13;
                  iVar36 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                           ((short)(uVar7 - uVar8 >> 0xf) * iVar36 >> 8);
                }
                *(uint8_t *)((long)local_2b0 + uVar34) =
                     (uint8_t)((uint)(iVar36 + 0x108000) >> 0x10);
                uVar34 = uVar34 + 1;
                lVar27 = lVar27 + step;
              } while (uVar31 != uVar34);
            }
            if (0 < (int)width) {
              iVar36 = picture->y_stride;
              uVar34 = 0;
              lVar27 = lVar26;
              do {
                bVar1 = puVar25[lVar27];
                bVar2 = g_ptr[lVar27];
                bVar3 = local_2d0[lVar27];
                if (rg == (VP8Random *)0x0) {
                  iVar13 = (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 + (uint)bVar3 * 0x1914;
                }
                else {
                  uVar7 = puVar52[rg->index1_];
                  uVar8 = puVar52[rg->index2_];
                  iVar13 = rg->amp_;
                  puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                  iVar33 = rg->index1_ + 1;
                  if (iVar33 == 0x37) {
                    iVar33 = 0;
                  }
                  rg->index1_ = iVar33;
                  iVar33 = rg->index2_ + 1;
                  if (iVar33 == 0x37) {
                    iVar33 = 0;
                  }
                  rg->index2_ = iVar33;
                  iVar13 = ((short)(uVar7 - uVar8 >> 0xf) * iVar13 >> 8) +
                           (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                *(uint8_t *)((long)local_2b0 + uVar34 + (long)iVar36) =
                     (uint8_t)((uint)(iVar13 + 0x108000) >> 0x10);
                uVar34 = uVar34 + 1;
                lVar27 = lVar27 + step;
              } while (uVar31 != uVar34);
            }
          }
          else if (r_ptr < b_ptr) {
            (*WebPConvertRGB24ToY)(puVar25,(uint8_t *)local_2b0,width);
            (*WebPConvertRGB24ToY)
                      (puVar25 + lVar26,(uint8_t *)((long)local_2b0 + (long)picture->y_stride),width
                      );
          }
          else {
            (*WebPConvertBGR24ToY)(local_2d0,(uint8_t *)local_2b0,width);
            (*WebPConvertBGR24ToY)
                      (local_2d0 + lVar26,(uint8_t *)((long)local_2b0 + (long)picture->y_stride),
                       width);
          }
          iVar36 = picture->y_stride;
          bVar60 = true;
          if (bVar59 == false) {
            iVar13 = (*WebPExtractAlpha)(local_260,rgb_stride,width,2,local_248,picture->a_stride);
            bVar60 = iVar13 != 0;
            local_248 = local_248 + (long)picture->a_stride * 2;
          }
          if (bVar60) {
            AccumulateRGB(puVar25,g_ptr,local_2d0,step,rgb_stride,puVar16,width);
          }
          else {
            AccumulateRGBA(puVar25,g_ptr,local_2d0,local_260,rgb_stride,puVar16,width);
          }
          if (rg == (VP8Random *)0x0) {
            (*WebPConvertRGBA32ToUV)(puVar16,puVar30,local_2a8,uVar40);
          }
          else if (0 < (int)uVar40) {
            uVar34 = 0;
            do {
              uVar4 = puVar16[uVar34 * 4];
              uVar5 = puVar16[uVar34 * 4 + 1];
              uVar6 = puVar16[uVar34 * 4 + 2];
              uVar7 = puVar52[rg->index1_];
              uVar8 = puVar52[rg->index2_];
              iVar13 = rg->amp_;
              puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
              iVar33 = rg->index1_ + 1;
              if (iVar33 == 0x37) {
                iVar33 = 0;
              }
              iVar39 = rg->index2_ + 1;
              if (iVar39 == 0x37) {
                iVar39 = 0;
              }
              rg->index1_ = iVar33;
              rg->index2_ = iVar39;
              iVar13 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                       0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar13 >> 8);
              if (iVar13 >> 0x12 < 1) {
                iVar13 = 0;
              }
              iVar13 = iVar13 >> 0x12;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              puVar30[uVar34] = (uint8_t)iVar13;
              uVar7 = puVar52[rg->index1_];
              uVar8 = puVar52[rg->index2_];
              iVar13 = rg->amp_;
              puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
              iVar33 = rg->index1_ + 1;
              if (iVar33 == 0x37) {
                iVar33 = 0;
              }
              iVar39 = rg->index2_ + 1;
              if (iVar39 == 0x37) {
                iVar39 = 0;
              }
              rg->index1_ = iVar33;
              rg->index2_ = iVar39;
              iVar13 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                       0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar13 >> 8);
              if (iVar13 >> 0x12 < 1) {
                iVar13 = 0;
              }
              iVar13 = iVar13 >> 0x12;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              local_2a8[uVar34] = (uint8_t)iVar13;
              uVar34 = uVar34 + 1;
            } while (uVar40 != uVar34);
          }
          local_2b0 = (uint16_t *)((long)local_2b0 + (long)iVar36 * 2);
          puVar30 = puVar30 + picture->uv_stride;
          local_2a8 = local_2a8 + picture->uv_stride;
          puVar25 = puVar25 + lVar18;
          local_2d0 = local_2d0 + lVar18;
          g_ptr = g_ptr + lVar18;
          local_260 = local_260 + lVar56;
          iVar12 = iVar12 + 1;
        } while (iVar12 != (int)height >> 1);
      }
      if ((height & 1) != 0) {
        if (!bVar9 || step != 3) {
          if (0 < (int)width) {
            uVar34 = 0;
            lVar56 = 0;
            do {
              bVar1 = puVar25[lVar56];
              bVar2 = g_ptr[lVar56];
              bVar3 = local_2d0[lVar56];
              if (rg == (VP8Random *)0x0) {
                iVar12 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
              }
              else {
                uVar7 = puVar52[rg->index1_];
                uVar8 = puVar52[rg->index2_];
                iVar12 = rg->amp_;
                puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                iVar36 = rg->index1_ + 1;
                if (iVar36 == 0x37) {
                  iVar36 = 0;
                }
                rg->index1_ = iVar36;
                iVar36 = rg->index2_ + 1;
                if (iVar36 == 0x37) {
                  iVar36 = 0;
                }
                rg->index2_ = iVar36;
                iVar12 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                         ((short)(uVar7 - uVar8 >> 0xf) * iVar12 >> 8);
              }
              *(uint8_t *)((long)local_2b0 + uVar34) = (uint8_t)((uint)(iVar12 + 0x108000) >> 0x10);
              uVar34 = uVar34 + 1;
              lVar56 = lVar56 + step;
            } while (uVar31 != uVar34);
          }
        }
        else {
          puVar43 = local_2d0;
          if (puVar25 < local_2d0) {
            puVar43 = puVar25;
          }
          pp_Var21 = &WebPConvertBGR24ToY;
          if (puVar25 < local_2d0) {
            pp_Var21 = &WebPConvertRGB24ToY;
          }
          (**pp_Var21)(puVar43,(uint8_t *)local_2b0,width);
        }
        if ((bVar59 == false) &&
           (iVar12 = (*WebPExtractAlpha)(local_260,0,width,1,local_248,0), iVar12 == 0)) {
          AccumulateRGBA(puVar25,g_ptr,local_2d0,local_260,0,puVar16,width);
        }
        else {
          AccumulateRGB(puVar25,g_ptr,local_2d0,step,0,puVar16,width);
        }
        if (rg == (VP8Random *)0x0) {
          (*WebPConvertRGBA32ToUV)(puVar16,puVar30,local_2a8,uVar40);
        }
        else if (0 < (int)uVar40) {
          iVar12 = 0;
          uVar31 = 0;
          do {
            uVar4 = puVar16[uVar31 * 4];
            uVar5 = puVar16[uVar31 * 4 + 1];
            uVar6 = puVar16[uVar31 * 4 + 2];
            uVar7 = puVar52[rg->index1_];
            uVar8 = puVar52[rg->index2_];
            iVar36 = rg->amp_;
            puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
            iVar13 = rg->index1_ + 1;
            if (iVar13 == 0x37) {
              iVar13 = iVar12;
            }
            iVar33 = rg->index2_ + 1;
            if (iVar33 == 0x37) {
              iVar33 = iVar12;
            }
            rg->index1_ = iVar13;
            rg->index2_ = iVar33;
            iVar36 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                     0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar36 >> 8);
            if (iVar36 >> 0x12 < 1) {
              iVar36 = 0;
            }
            iVar36 = iVar36 >> 0x12;
            if (0xfe < iVar36) {
              iVar36 = 0xff;
            }
            puVar30[uVar31] = (uint8_t)iVar36;
            uVar7 = puVar52[rg->index1_];
            uVar8 = puVar52[rg->index2_];
            iVar36 = rg->amp_;
            puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
            iVar13 = rg->index1_ + 1;
            if (iVar13 == 0x37) {
              iVar13 = iVar12;
            }
            iVar33 = rg->index2_ + 1;
            if (iVar33 == 0x37) {
              iVar33 = iVar12;
            }
            rg->index1_ = iVar13;
            rg->index2_ = iVar33;
            iVar36 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                     0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar36 >> 8);
            if (iVar36 >> 0x12 < 1) {
              iVar36 = 0;
            }
            iVar36 = iVar36 >> 0x12;
            if (0xfe < iVar36) {
              iVar36 = 0xff;
            }
            local_2a8[uVar31] = (uint8_t)iVar36;
            uVar31 = uVar31 + 1;
          } while (uVar40 != uVar31);
        }
      }
      WebPSafeFree(puVar16);
      if (puVar16 != (uint16_t *)0x0) goto LAB_0012a0f1;
    }
    iVar12 = 0;
  }
  else {
    iVar12 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
    if (iVar12 == 0) {
      if (((VP8CPUInfo)InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used != VP8GetCPUInfo) &&
         (kGammaTablesSOk == 0)) {
        puVar52 = kGammaToLinearTabS;
        lVar56 = 0;
        do {
          dVar61 = (double)(int)lVar56 * 0.0009775171065493646;
          if (dVar61 <= 0.08124285829863151) {
            dVar61 = dVar61 / 4.5;
          }
          else {
            dVar61 = pow((dVar61 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
          }
          *puVar52 = (uint32_t)(long)(dVar61 * 16384.0 + 0.5);
          lVar56 = lVar56 + 1;
          puVar52 = puVar52 + 1;
        } while (lVar56 != 0x400);
        puVar52 = kLinearToGammaTabS;
        lVar56 = 0;
        do {
          dVar61 = (double)(int)lVar56 * 0.03125;
          if (dVar61 <= 0.018053968510807) {
            dVar61 = dVar61 * 4.5;
          }
          else {
            dVar61 = pow(dVar61,0.44999999999999996);
            dVar61 = dVar61 * 1.09929682680944 + -0.09929682680944;
          }
          *puVar52 = (int)(long)(dVar61 * 1023.0) + 0x2000;
          lVar56 = lVar56 + 1;
          puVar52 = puVar52 + 1;
        } while (lVar56 != 0x21);
        kLinearToGammaTabS[0x21] = kLinearToGammaTabS[0x20];
        kGammaTablesSOk = 1;
      }
      InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used = VP8GetCPUInfo;
      pthread_mutex_unlock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
    }
    uVar34 = (long)picture->width + 1;
    uVar31 = (long)picture->height + 1;
    uVar57 = uVar31 & 0xfffffffffffffffe;
    iVar33 = (int)uVar34 >> 1;
    iVar12 = (int)(uVar34 & 0xfffffffffffffffe);
    uVar40 = iVar12 * 2;
    uVar48 = (ulong)uVar40;
    dst_00 = (fixed_y_t *)WebPSafeMalloc((long)(iVar12 * 6),2);
    uVar53 = (uVar34 & 0xfffffffffffffffe) * uVar57;
    puVar16 = (uint16_t *)WebPSafeMalloc(uVar53,2);
    puVar17 = (uint16_t *)WebPSafeMalloc(uVar53,2);
    uVar53 = (uint64_t)(int)uVar40;
    ptr = (uint16_t *)WebPSafeMalloc(uVar53,2);
    iVar36 = iVar33 * 3;
    uVar54 = (uint64_t)(((int)uVar31 >> 1) * iVar36);
    ptr_00 = (int16_t *)WebPSafeMalloc(uVar54,2);
    ptr_01 = (fixed_t *)WebPSafeMalloc(uVar54,2);
    uVar54 = (uint64_t)iVar36;
    dst_01 = (fixed_t *)WebPSafeMalloc(uVar54,2);
    auVar62._0_4_ = -(uint)((int)((ulong)puVar16 >> 0x20) == 0 && (int)puVar16 == 0);
    auVar62._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
    auVar62._8_4_ = -(uint)((int)puVar17 == 0 && (int)((ulong)puVar17 >> 0x20) == 0);
    auVar62._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
    iVar13 = movmskps((int)dst_01,auVar62);
    if ((((iVar13 == 0) && (ptr != (uint16_t *)0x0)) && (dst_01 != (fixed_t *)0x0)) &&
       (dst_00 != (fixed_y_t *)0x0)) {
      local_1d0 = (int)uVar57;
      dVar61 = (double)local_1d0 * (double)iVar12 * 3.0;
      uVar31 = (ulong)dVar61;
      WebPInitConvertARGBToYUV();
      iVar13 = picture->height;
      lVar56 = (long)(iVar12 * 3);
      uVar57 = uVar34 & 0xfffffffe;
      lVar18 = (long)iVar12;
      if (0 < iVar13) {
        dst = dst_00 + lVar56;
        iVar39 = rgb_stride * 2;
        uVar50 = uVar34 >> 1 & 0x7fffffff;
        local_2b0 = puVar16 + lVar18;
        puVar29 = puVar17 + lVar18;
        iVar46 = 0;
        puVar41 = puVar16;
        local_2b8 = puVar17;
        local_220 = ptr_01;
        local_218 = ptr_00;
        do {
          ImportOneRow(r_ptr,g_ptr,b_ptr,step,picture->width,dst_00);
          if (iVar46 == iVar13 + -1) {
            memcpy(dst,dst_00,lVar56 * 2);
          }
          else {
            ImportOneRow(r_ptr + rgb_stride,g_ptr + rgb_stride,b_ptr + rgb_stride,step,
                         picture->width,dst);
          }
          if (0 < iVar12) {
            uVar19 = 0;
            do {
              puVar41[uVar19] =
                   (uint16_t)
                   ((uint)dst_00[uVar48 + uVar19] * 0x127c +
                    (uint)dst_00[uVar50 * 2 + uVar19] * 0xb717 + (uint)dst_00[uVar19] * 0x366d +
                    0x8000 >> 0x10);
              uVar19 = uVar19 + 1;
            } while (uVar57 != uVar19);
          }
          if (0 < iVar12) {
            uVar19 = 0;
            do {
              local_2b0[uVar19] =
                   (uint16_t)
                   ((uint)dst_00[lVar56 + uVar48 + uVar19] * 0x127c +
                    (uint)dst_00[uVar50 * 2 + lVar56 + uVar19] * 0xb717 + (uint)dst[uVar19] * 0x366d
                    + 0x8000 >> 0x10);
              uVar19 = uVar19 + 1;
            } while (uVar57 != uVar19);
            if (0 < iVar12) {
              uVar19 = 0;
              do {
                uVar22 = (int)(kGammaToLinearTabS[dst_00[uVar48 + uVar19]] * 0x127c +
                               kGammaToLinearTabS[dst_00[uVar50 * 2 + uVar19]] * 0xb717 +
                               kGammaToLinearTabS[dst_00[uVar19]] * 0x366d + 0x8000) >> 0xb;
                uVar24 = (ulong)(uVar22 >> 0xe);
                local_2b8[uVar19] =
                     (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24]) *
                             (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar24];
                uVar19 = uVar19 + 1;
              } while (uVar57 != uVar19);
            }
          }
          if (0 < iVar12) {
            uVar19 = 0;
            do {
              uVar22 = (int)(kGammaToLinearTabS[dst_00[lVar56 + uVar48 + uVar19]] * 0x127c +
                             kGammaToLinearTabS[dst_00[uVar50 * 2 + lVar56 + uVar19]] * 0xb717 +
                             kGammaToLinearTabS[dst[uVar19]] * 0x366d + 0x8000) >> 0xb;
              uVar24 = (ulong)(uVar22 >> 0xe);
              puVar29[uVar19] =
                   (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24]) *
                           (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar24];
              uVar19 = uVar19 + 1;
            } while (uVar57 != uVar19);
          }
          UpdateChroma(dst_00,dst,local_220,iVar33);
          memcpy(local_218,local_220,uVar54 * 2);
          local_218 = local_218 + uVar54;
          local_220 = local_220 + uVar54;
          r_ptr = r_ptr + iVar39;
          g_ptr = g_ptr + iVar39;
          b_ptr = b_ptr + iVar39;
          iVar46 = iVar46 + 2;
          iVar13 = picture->height;
          puVar41 = puVar41 + uVar53;
          local_2b0 = local_2b0 + uVar53;
          local_2b8 = local_2b8 + uVar53;
          puVar29 = puVar29 + uVar53;
        } while (iVar46 < iVar13);
      }
      iVar39 = iVar12 + -1 >> 1;
      lVar26 = (long)iVar33 * 2 + -2;
      uVar34 = uVar34 >> 1 & 0x7fffffff;
      lVar27 = lVar18 * 2;
      local_180 = 0xffffffffffffffff;
      iVar13 = 0;
      do {
        if (local_1d0 < 1) {
          uVar50 = 0;
        }
        else {
          uVar50 = 0;
          iVar46 = 0;
          puVar29 = puVar16;
          piVar44 = ptr_00;
          local_298 = ptr_00;
          local_228 = puVar17;
          local_208 = ptr_00;
          local_200 = ptr_01;
          do {
            piVar45 = piVar44;
            iVar14 = 0;
            if (iVar46 < local_1d0 + -2) {
              iVar14 = iVar36;
            }
            piVar44 = piVar45 + iVar14;
            iVar23 = -3;
            lVar58 = 0;
            lVar49 = 0;
            lVar32 = lVar56 * 2;
            lVar37 = lVar56 * 2 + (long)(iVar12 + -2) * 2 + 2;
            lVar42 = (long)(iVar12 + -2) * 2 + 2;
            do {
              iVar15 = (*(short *)((long)piVar45 + lVar49) * 3 +
                        (int)*(short *)((long)local_298 + lVar49) + 2 >> 2) + (uint)*puVar29;
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              uVar11 = (undefined2)iVar15;
              if (0x3fe < iVar15) {
                uVar11 = 0x3ff;
              }
              *(undefined2 *)((long)dst_00 + lVar58) = uVar11;
              iVar15 = (*(short *)((long)piVar45 + lVar49) * 3 +
                        (int)*(short *)((long)piVar44 + lVar49) + 2 >> 2) + (uint)puVar29[lVar18];
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              uVar11 = (undefined2)iVar15;
              if (0x3fe < iVar15) {
                uVar11 = 0x3ff;
              }
              *(undefined2 *)((long)dst_00 + lVar32) = uVar11;
              (*WebPSharpYUVFilterRow)
                        ((int16_t *)((long)piVar45 + lVar49),(int16_t *)((long)local_298 + lVar49),
                         iVar39,puVar29 + 1,(uint16_t *)((long)dst_00 + lVar58 + 2));
              (*WebPSharpYUVFilterRow)
                        ((int16_t *)((long)piVar45 + lVar49),(int16_t *)((long)piVar44 + lVar49),
                         iVar39,puVar29 + lVar18 + 1,(uint16_t *)((long)dst_00 + lVar32 + 2));
              iVar15 = (*(short *)((long)piVar45 + lVar49 + lVar26) * 3 +
                        (int)*(short *)((long)local_298 + lVar49 + lVar26) + 2 >> 2) +
                       (uint)puVar29[iVar12 + -1];
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              uVar11 = (undefined2)iVar15;
              if (0x3fe < iVar15) {
                uVar11 = 0x3ff;
              }
              *(undefined2 *)((long)dst_00 + lVar42) = uVar11;
              iVar15 = (*(short *)((long)piVar45 + lVar49 + lVar26) * 3 +
                        (int)*(short *)((long)piVar45 + lVar49 + (long)iVar14 * 2 + lVar26) + 2 >> 2
                       ) + (uint)puVar29[iVar12 * 2 + -1];
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              uVar11 = (undefined2)iVar15;
              if (0x3fe < iVar15) {
                uVar11 = 0x3ff;
              }
              *(undefined2 *)((long)dst_00 + lVar37) = uVar11;
              lVar49 = lVar49 + (long)iVar33 * 2;
              lVar37 = lVar37 + lVar27;
              lVar32 = lVar32 + lVar27;
              lVar42 = lVar42 + lVar27;
              lVar58 = lVar58 + lVar27;
              iVar23 = iVar23 + 1;
            } while (iVar23 != 0);
            if (0 < iVar12) {
              uVar19 = 0;
              do {
                uVar22 = (int)(kGammaToLinearTabS[dst_00[uVar48 + uVar19]] * 0x127c +
                               kGammaToLinearTabS[dst_00[uVar34 * 2 + uVar19]] * 0xb717 +
                               kGammaToLinearTabS[dst_00[uVar19]] * 0x366d + 0x8000) >> 0xb;
                uVar24 = (ulong)(uVar22 >> 0xe);
                ptr[uVar19] = (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24])
                                      * (uVar22 & 0x3fe0) >> 0xe) +
                              (short)kLinearToGammaTabS[uVar24];
                uVar19 = uVar19 + 1;
              } while (uVar57 != uVar19);
              if (0 < iVar12) {
                uVar19 = 0;
                do {
                  uVar22 = (int)(kGammaToLinearTabS[dst_00[lVar56 + uVar48 + uVar19]] * 0x127c +
                                 kGammaToLinearTabS[dst_00[uVar34 * 2 + lVar56 + uVar19]] * 0xb717 +
                                 kGammaToLinearTabS[(dst_00 + lVar56)[uVar19]] * 0x366d + 0x8000) >>
                           0xb;
                  uVar24 = (ulong)(uVar22 >> 0xe);
                  ptr[lVar18 + uVar19] =
                       (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24]) *
                               (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar24];
                  uVar19 = uVar19 + 1;
                } while (uVar57 != uVar19);
              }
            }
            UpdateChroma(dst_00,dst_00 + lVar56,dst_01,iVar33);
            uVar20 = (*WebPSharpYUVUpdateY)(local_228,ptr,puVar29,uVar40);
            uVar50 = uVar50 + uVar20;
            (*WebPSharpYUVUpdateRGB)(local_200,dst_01,local_208,iVar36);
            puVar29 = puVar29 + uVar53;
            local_208 = local_208 + uVar54;
            local_228 = local_228 + uVar53;
            local_200 = local_200 + uVar54;
            iVar46 = iVar46 + 2;
            local_298 = piVar45;
          } while (iVar46 < local_1d0);
        }
        if ((iVar13 == 0) ||
           (bVar9 = true,
           uVar50 <= local_180 &&
           (uVar31 | (long)(dVar61 - 9.223372036854776e+18) & (long)uVar31 >> 0x3f) <= uVar50)) {
          bVar9 = false;
          local_180 = uVar50;
        }
      } while ((!bVar9) && (iVar13 = iVar13 + 1, iVar13 != 4));
      puVar30 = picture->u;
      puVar25 = picture->v;
      uVar22 = picture->width + 1;
      uVar40 = uVar22 & 0xfffffffe;
      uVar22 = (int)uVar22 >> 1;
      iVar12 = picture->height + 1 >> 1;
      if (0 < picture->height) {
        puVar43 = picture->y;
        uVar47 = 0;
        puVar29 = puVar16;
        piVar44 = ptr_00;
        do {
          if (0 < picture->width) {
            uVar31 = 0;
            do {
              uVar10 = (uint)(uVar31 >> 1) & 0x7fffffff;
              iVar36 = (int)(((int)piVar44[(int)(uVar10 + uVar40)] + (uint)puVar29[uVar31]) * 0x1914
                             + piVar44[(int)(uVar10 + uVar22)] * 0x8123 +
                               (uint)puVar29[uVar31] * 0xc2ea +
                               *(short *)((long)piVar44 + (ulong)((uint)uVar31 & 0xfffffffe)) *
                               0x41c7 + 0x20000) >> 0x12;
              uVar10 = iVar36 + 0x10;
              uVar35 = -(-0x11 < iVar36);
              if ((uVar10 & 0xffff) < 0x100) {
                uVar35 = (uint8_t)uVar10;
              }
              puVar43[uVar31] = uVar35;
              uVar31 = uVar31 + 1;
            } while ((long)uVar31 < (long)picture->width);
          }
          piVar44 = piVar44 + (int)((uVar47 & 1) * uVar22 * 3);
          puVar43 = puVar43 + picture->y_stride;
          uVar47 = uVar47 + 1;
          puVar29 = puVar29 + (int)uVar40;
        } while ((int)uVar47 < picture->height);
      }
      if (0 < iVar12) {
        iVar36 = uVar22 * 3;
        piVar44 = ptr_00 + (int)uVar40;
        piVar45 = ptr_00 + (int)uVar22;
        iVar13 = 0;
        piVar55 = ptr_00;
        do {
          if (0 < (int)uVar22) {
            uVar31 = 0;
            do {
              iVar33 = piVar44[uVar31] * 0x7080 + 0x20000 +
                       piVar45[uVar31] * -0x4a89 + piVar55[uVar31] * -0x25f7;
              iVar39 = iVar33 >> 0x12;
              cVar28 = (char)iVar39;
              uVar35 = -(-0x81 < iVar39);
              if ((short)cVar28 == (short)(iVar33 >> 0x12)) {
                uVar35 = cVar28 + 0x80;
              }
              iVar33 = piVar44[uVar31] * -0x124c + 0x20000 +
                       piVar45[uVar31] * -0x5e34 + piVar55[uVar31] * 0x7080;
              iVar39 = iVar33 >> 0x12;
              cVar28 = (char)iVar39;
              uVar38 = -(-0x81 < iVar39);
              if ((short)cVar28 == (short)(iVar33 >> 0x12)) {
                uVar38 = cVar28 + 0x80;
              }
              puVar30[uVar31] = uVar35;
              puVar25[uVar31] = uVar38;
              uVar31 = uVar31 + 1;
            } while (uVar22 != uVar31);
          }
          puVar30 = puVar30 + picture->uv_stride;
          puVar25 = puVar25 + picture->uv_stride;
          iVar13 = iVar13 + 1;
          piVar44 = piVar44 + iVar36;
          piVar45 = piVar45 + iVar36;
          piVar55 = piVar55 + iVar36;
        } while (iVar13 != iVar12);
      }
      WebPSafeFree(puVar16);
      WebPSafeFree(ptr_00);
      WebPSafeFree(puVar17);
      WebPSafeFree(ptr_01);
      WebPSafeFree(ptr);
      WebPSafeFree(dst_01);
      WebPSafeFree(dst_00);
    }
    else {
      iVar12 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
      WebPSafeFree(puVar16);
      WebPSafeFree(ptr_00);
      WebPSafeFree(puVar17);
      WebPSafeFree(ptr_01);
      WebPSafeFree(ptr);
      WebPSafeFree(dst_01);
      WebPSafeFree(dst_00);
      if (iVar12 == 0) {
        return 0;
      }
    }
    if (bVar59 == false) {
      (*WebPExtractAlpha)(a_ptr,rgb_stride,width,height,picture->a,picture->a_stride);
    }
LAB_0012a0f1:
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture, width, height)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + kGammaFix <= 31);
#endif
  }

  if (use_iterative_conversion) {
    InitGammaTablesS();
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) return 0;  // malloc error

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}